

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void kj::anon_unknown_6::registerReservedSignal(void)

{
  __sighandler_t p_Var1;
  int *piVar2;
  Fault local_18;
  Fault f;
  int error;
  
  registerSignalHandler((anonymous_namespace)::reservedSignal);
  while( true ) {
    p_Var1 = signal(0xd,(__sighandler_t)0x1);
    if (p_Var1 != (__sighandler_t)0xffffffffffffffff) {
      return;
    }
    piVar2 = __errno_location();
    f.exception._4_4_ = *piVar2;
    if (f.exception._4_4_ != 4) break;
    f.exception._4_4_ = 4;
  }
  _::Debug::Fault::Fault
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x6b,f.exception._4_4_,"signal(SIGPIPE, SIG_IGN)","");
  _::Debug::Fault::fatal(&local_18);
}

Assistant:

void registerReservedSignal() {
  registerSignalHandler(reservedSignal);

  // We also disable SIGPIPE because users of UnixEventPort almost certainly don't want it.
  while (signal(SIGPIPE, SIG_IGN) == SIG_ERR) {
    int error = errno;
    if (error != EINTR) {
      KJ_FAIL_SYSCALL("signal(SIGPIPE, SIG_IGN)", error);
    }
  }
}